

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool op_div(DisasContext_conflict1 *s,arg_rrr *a,_Bool u)

{
  uint uVar1;
  int iVar2;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  _Bool _Var3;
  TCGTemp *ret;
  TCGTemp *pTVar4;
  TCGv_i32 var;
  code *func;
  TCGContext_conflict1 *tcg_ctx;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  s_00 = s->uc->tcg_ctx;
  uVar1 = s->isar->id_isar0;
  if (s->thumb == 0) {
    uVar1 = uVar1 & 0xe000000;
  }
  else {
    uVar1 = uVar1 & 0xf000000;
  }
  if (uVar1 == 0) {
    _Var3 = false;
  }
  else {
    iVar2 = a->rn;
    ret = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    load_reg_var(s,(TCGv_i32)((long)ret - (long)s_00),iVar2);
    iVar2 = a->rm;
    s_01 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar4 - (long)s_01);
    load_reg_var(s,var,iVar2);
    pTVar4 = (TCGTemp *)(var + (long)s_00);
    if (u) {
      func = helper_udiv_aarch64;
    }
    else {
      func = helper_sdiv_aarch64;
    }
    local_48 = ret;
    local_40 = pTVar4;
    tcg_gen_callN_aarch64(s_00,func,ret,2,&local_48);
    tcg_temp_free_internal_aarch64(s_00,pTVar4);
    store_reg(s,a->rd,(TCGv_i32)((long)ret - (long)s_00));
    _Var3 = true;
  }
  return _Var3;
}

Assistant:

static bool op_div(DisasContext *s, arg_rrr *a, bool u)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    if (s->thumb
        ? !dc_isar_feature(aa32_thumb_div, s)
        : !dc_isar_feature(aa32_arm_div, s)) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    if (u) {
        gen_helper_udiv(tcg_ctx, t1, t1, t2);
    } else {
        gen_helper_sdiv(tcg_ctx, t1, t1, t2);
    }
    tcg_temp_free_i32(tcg_ctx, t2);
    store_reg(s, a->rd, t1);
    return true;
}